

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbanks_decoder.cpp
# Opt level: O0

HuffmanTree * io::decode_huffman_tree(ROM *rom,uint32_t addr)

{
  bool bVar1;
  uint8_t symbol;
  HuffmanTree *this;
  uint8_t *data;
  HuffmanTreeNode *pHVar2;
  HuffmanTreeNode *this_00;
  undefined1 local_58 [8];
  BitstreamReader bitstream;
  HuffmanTreeNode *pHStack_38;
  uint32_t current_symbol_addr;
  HuffmanTreeNode *current_node;
  HuffmanTree *tree;
  uint32_t addr_local;
  ROM *rom_local;
  
  this = (HuffmanTree *)operator_new(0x38);
  HuffmanTree::HuffmanTree(this);
  pHStack_38 = HuffmanTree::root_node(this);
  bitstream._size._4_4_ = addr - 1;
  data = md::ROM::iterator_at(rom,addr);
  BitstreamReader::BitstreamReader((BitstreamReader *)local_58,data);
  while( true ) {
    while (bVar1 = BitstreamReader::next_bit((BitstreamReader *)local_58), !bVar1) {
      pHVar2 = (HuffmanTreeNode *)operator_new(0x20);
      memset(pHVar2,0,0x20);
      HuffmanTreeNode::HuffmanTreeNode(pHVar2);
      HuffmanTreeNode::left_child(pHStack_38,pHVar2);
      pHStack_38 = HuffmanTreeNode::left_child(pHStack_38);
    }
    symbol = md::ROM::get_byte(rom,bitstream._size._4_4_);
    HuffmanTreeNode::symbol(pHStack_38,symbol);
    bitstream._size._4_4_ = bitstream._size._4_4_ - 1;
    while( true ) {
      pHVar2 = HuffmanTreeNode::parent(pHStack_38);
      bVar1 = false;
      if (pHVar2 != (HuffmanTreeNode *)0x0) {
        pHVar2 = HuffmanTreeNode::parent(pHStack_38);
        pHVar2 = HuffmanTreeNode::right_child(pHVar2);
        bVar1 = pHVar2 != (HuffmanTreeNode *)0x0;
      }
      if (!bVar1) break;
      pHStack_38 = HuffmanTreeNode::parent(pHStack_38);
    }
    pHVar2 = HuffmanTree::root_node(this);
    if (pHStack_38 == pHVar2) break;
    pHVar2 = HuffmanTreeNode::parent(pHStack_38);
    this_00 = (HuffmanTreeNode *)operator_new(0x20);
    memset(this_00,0,0x20);
    HuffmanTreeNode::HuffmanTreeNode(this_00);
    HuffmanTreeNode::right_child(pHVar2,this_00);
    pHVar2 = HuffmanTreeNode::parent(pHStack_38);
    pHStack_38 = HuffmanTreeNode::right_child(pHVar2);
  }
  return this;
}

Assistant:

HuffmanTree* io::decode_huffman_tree(const md::ROM& rom, uint32_t addr)
{
    HuffmanTree* tree = new HuffmanTree();
    HuffmanTreeNode* current_node = tree->root_node();
    uint32_t current_symbol_addr = addr - 1;

    BitstreamReader bitstream(rom.iterator_at(addr));

    while(true)
    {
        if(!bitstream.next_bit())
        {
            // Branch node case
            current_node->left_child(new HuffmanTreeNode());
            current_node = current_node->left_child();
        }
        else
        {
            // Leaf node case: read the symbol value BEFORE the initial offset
            current_node->symbol(rom.get_byte(current_symbol_addr));
            current_symbol_addr -= 1;

            // If current node's parent has a right child, it means we completed this branch of the tree
            // and we need to get back at a higher level
            while (current_node->parent() && current_node->parent()->right_child())
            {
                current_node = current_node->parent();
            }

            // If we got back to root node, it means the whole tree is finished
            if (current_node == tree->root_node())
                return tree;

            current_node->parent()->right_child(new HuffmanTreeNode());
            current_node = current_node->parent()->right_child();
        }
    }
}